

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCppFile.h
# Opt level: O0

void __thiscall cppforth::Forth::fileSize(Forth *this)

{
  undefined4 uVar1;
  byte bVar2;
  uint uVar3;
  element_type *peVar4;
  unsigned_long_long uVar5;
  fpos local_f8 [16];
  anon_union_8_4_a234c5df_for_data_ local_e8;
  DCell currentPosition;
  DCell position;
  uintmax_t filesize;
  string local_a0 [32];
  undefined1 local_80 [8];
  shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_> f;
  allocator<char> local_59;
  string local_58;
  undefined1 local_38 [8];
  string filename;
  uint h;
  Forth *this_local;
  
  requireDStackDepth(this,1,"FILE-SIZE");
  uVar3 = ForthStack<unsigned_int>::getTop(&this->dStack);
  filename.field_2._12_4_ = uVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"FILE-SIZE",&local_59);
  GetFileName((string *)local_38,this,uVar3,&local_58,errorFilePosition);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  uVar1 = filename.field_2._12_4_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_a0,"FILE-SIZE",(allocator<char> *)((long)&filesize + 7));
  GetFileHandle((Forth *)local_80,(Cell)this,(string *)(ulong)(uint)uVar1,(errorCodes)local_a0);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&filesize + 7));
  peVar4 = std::
           __shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_80);
  std::ios::clear((int)peVar4 + (int)*(undefined8 *)(*(long *)peVar4 + -0x18));
  std::
  __shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)local_80);
  std::ostream::flush();
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            ((path *)&position,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
             auto_format);
  uVar5 = std::filesystem::file_size((path *)&position);
  std::filesystem::__cxx11::path::~path((path *)&position);
  DCell::DCell(&currentPosition,uVar5);
  std::
  __shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)local_80);
  local_f8 = (fpos  [16])std::istream::tellg();
  uVar5 = std::fpos::operator_cast_to_long(local_f8);
  DCell::DCell((DCell *)&local_e8.Cells,uVar5);
  if ((long)currentPosition.data_ < local_e8.SDcells) {
    currentPosition.data_ =
         (anon_union_8_4_a234c5df_for_data_)(anon_union_8_4_a234c5df_for_data_)local_e8.Cells;
  }
  ForthStack<unsigned_int>::setTop(&this->dStack,0,currentPosition.data_.Cells.lo);
  ForthStack<unsigned_int>::push(&this->dStack,currentPosition.data_.Cells.hi);
  std::
  __shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)local_80);
  bVar2 = std::ios::bad();
  uVar3 = 0;
  if ((bVar2 & 1) != 0) {
    uVar3 = 0xffffffbf;
  }
  ForthStack<unsigned_int>::push(&this->dStack,uVar3);
  std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>::~shared_ptr
            ((shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_> *)local_80);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void fileSize() {
	REQUIRE_DSTACK_DEPTH(1, "FILE-SIZE");
	auto h = (dStack.getTop());
	auto filename = GetFileName(h, "FILE-SIZE", errorFilePosition);
	auto f = GetFileHandle(h, "FILE-SIZE", errorFilePosition);
	f->clear();
	f->flush();
	auto filesize = std::filesystem::file_size(filename);
	DCell position(filesize);
	DCell currentPosition(f->tellg());
	if (currentPosition.data_.SDcells > position.data_.SDcells) {
		// if OS was not updated filesize of open file, we take biggest value
		position = currentPosition;
	}
	dStack.setTop(0, position.data_.Cells.lo);
	dStack.push(position.data_.Cells.hi);
	dStack.push(f->bad() ? Cell(errorFilePosition) : 0);
}